

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O2

void util::rpn_map_multichar_op(string *str)

{
  bool bVar1;
  char cVar2;
  
  bVar1 = std::operator==(str,"==");
  cVar2 = '=';
  if (!bVar1) {
    bVar1 = std::operator==(str,"!=");
    cVar2 = '\x02';
    if (!bVar1) {
      bVar1 = std::operator==(str,"<=");
      cVar2 = '\x03';
      if (!bVar1) {
        bVar1 = std::operator==(str,">=");
        cVar2 = '\x04';
        if (!bVar1) {
          bVar1 = std::operator==(str,"&&");
          cVar2 = '\x05';
          if (!bVar1) {
            bVar1 = std::operator==(str,"||");
            cVar2 = '\x06';
            if (!bVar1) {
              return;
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::operator=((string *)str,cVar2);
  return;
}

Assistant:

static void rpn_map_multichar_op(std::string& str)
{
	if (str == "==")
		str = '=';
	else if (str == "!=")
		str = op_ne;
	else if (str == "<=")
		str = op_lte;
	else if (str == ">=")
		str = op_gte;
	else if (str == "&&")
		str = op_and;
	else if (str == "||")
		str = op_or;
}